

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_broadcast(compiler_state_t *cstate,int proto)

{
  int iVar1;
  block *pbVar2;
  block *b0;
  block *b1;
  ulong uVar3;
  uint mask;
  char *fmt;
  
  if (1 < (uint)proto) {
    if (proto != 2) {
      fmt = "only link-layer/IP broadcast filters supported";
      goto LAB_0010ea72;
    }
    if (cstate->netmask == 0xffffffff) {
      fmt = "netmask not known, so \'ip broadcast\' not supported";
      goto LAB_0010ea72;
    }
    b0 = gen_linktype(cstate,0x800);
    mask = ~cstate->netmask;
    pbVar2 = gen_mcmp(cstate,OR_LINKPL,0x10,0,0,mask);
    b1 = gen_mcmp(cstate,OR_LINKPL,0x10,0,mask,mask);
    gen_or(pbVar2,b1);
    goto LAB_0010e9c4;
  }
  iVar1 = cstate->linktype;
  uVar3 = (ulong)(iVar1 - 0x69U);
  if (iVar1 - 0x69U < 0x3b) {
    if ((0x400000000404001U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0010e974;
    if (uVar3 == 0x11) {
      pbVar2 = gen_ipfchostop(cstate,gen_broadcast::ebroadcast,2);
      return pbVar2;
    }
    if (uVar3 == 0x18) goto switchD_0010e8d0_caseD_7;
  }
  switch(iVar1) {
  case 1:
    goto switchD_0010e8d0_caseD_1;
  case 2:
  case 3:
  case 4:
  case 5:
  case 8:
  case 9:
switchD_0010e8d0_caseD_2:
    fmt = "not a broadcast link";
LAB_0010ea72:
    bpf_error(cstate,fmt);
  case 6:
    pbVar2 = gen_thostop(cstate,gen_broadcast::ebroadcast,2);
    return pbVar2;
  case 7:
switchD_0010e8d0_caseD_7:
    pbVar2 = gen_ahostop(cstate,(u_char *)"",2);
    return pbVar2;
  case 10:
    pbVar2 = gen_fhostop(cstate,gen_broadcast::ebroadcast,2);
    return pbVar2;
  default:
    if (1 < iVar1 - 0xf0U) {
      if (iVar1 == 0xc0) {
LAB_0010e974:
        pbVar2 = gen_wlanhostop(cstate,gen_broadcast::ebroadcast,2);
        return pbVar2;
      }
      goto switchD_0010e8d0_caseD_2;
    }
switchD_0010e8d0_caseD_1:
    b0 = gen_prevlinkhdr_check(cstate);
    b1 = gen_ehostop(cstate,gen_broadcast::ebroadcast,2);
    if (b0 == (block *)0x0) {
      return b1;
    }
LAB_0010e9c4:
    gen_and(b0,b1);
    return b1;
  }
}

Assistant:

struct block *
gen_broadcast(compiler_state_t *cstate, int proto)
{
	bpf_u_int32 hostmask;
	struct block *b0, *b1, *b2;
	static const u_char ebroadcast[] = { 0xff, 0xff, 0xff, 0xff, 0xff, 0xff };

	switch (proto) {

	case Q_DEFAULT:
	case Q_LINK:
		switch (cstate->linktype) {
		case DLT_ARCNET:
		case DLT_ARCNET_LINUX:
			return gen_ahostop(cstate, abroadcast, Q_DST);
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			b1 = gen_prevlinkhdr_check(cstate);
			b0 = gen_ehostop(cstate, ebroadcast, Q_DST);
			if (b1 != NULL)
				gen_and(b1, b0);
			return b0;
		case DLT_FDDI:
			return gen_fhostop(cstate, ebroadcast, Q_DST);
		case DLT_IEEE802:
			return gen_thostop(cstate, ebroadcast, Q_DST);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			return gen_wlanhostop(cstate, ebroadcast, Q_DST);
		case DLT_IP_OVER_FC:
			return gen_ipfchostop(cstate, ebroadcast, Q_DST);
		default:
			bpf_error(cstate, "not a broadcast link");
		}
		break;

	case Q_IP:
		/*
		 * We treat a netmask of PCAP_NETMASK_UNKNOWN (0xffffffff)
		 * as an indication that we don't know the netmask, and fail
		 * in that case.
		 */
		if (cstate->netmask == PCAP_NETMASK_UNKNOWN)
			bpf_error(cstate, "netmask not known, so 'ip broadcast' not supported");
		b0 = gen_linktype(cstate, ETHERTYPE_IP);
		hostmask = ~cstate->netmask;
		b1 = gen_mcmp(cstate, OR_LINKPL, 16, BPF_W, (bpf_int32)0, hostmask);
		b2 = gen_mcmp(cstate, OR_LINKPL, 16, BPF_W,
			      (bpf_int32)(~0 & hostmask), hostmask);
		gen_or(b1, b2);
		gen_and(b0, b2);
		return b2;
	}
	bpf_error(cstate, "only link-layer/IP broadcast filters supported");
	/* NOTREACHED */
	return NULL;
}